

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserTransform.cpp
# Opt level: O1

bool __thiscall
Rml::PropertyParserTransform::Scan
          (PropertyParserTransform *this,int *out_bytes_read,char *str,char *keyword,
          PropertyParser **parsers,NumericValue *args,int nargs)

{
  PropertyParser *pPVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  char cVar8;
  bool bVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  byte bVar13;
  String arg_heap;
  Property prop;
  char arg_stack [1024];
  int local_548;
  byte local_541;
  char *local_540;
  ulong local_538;
  float local_52c;
  char *local_528;
  char *local_520;
  undefined8 local_518;
  char local_510;
  undefined7 uStack_50f;
  long *local_500 [2];
  long local_4f0 [2];
  int *local_4e0;
  long local_4d8;
  NumericValue *local_4d0;
  ulong local_4c8;
  PropertyParser **local_4c0;
  undefined1 local_4b8 [32];
  size_t local_498;
  undefined8 local_490;
  Property local_488;
  char local_438 [1032];
  
  bVar9 = false;
  *out_bytes_read = 0;
  local_548 = 0;
  local_4e0 = out_bytes_read;
  local_4d0 = args;
  local_4c0 = parsers;
  __isoc99_sscanf(str," %n",&local_548);
  iVar4 = local_548;
  pcVar12 = str + local_548;
  sVar5 = strlen(keyword);
  iVar3 = bcmp(pcVar12,keyword,sVar5);
  if (iVar3 == 0) {
    pcVar12 = pcVar12 + (int)sVar5;
    local_548 = 0;
    __isoc99_sscanf(pcVar12," %n",&local_548);
    iVar3 = local_548;
    lVar11 = (long)local_548;
    local_548 = 0;
    __isoc99_sscanf(pcVar12 + lVar11," ( %n",&local_548);
    iVar2 = local_548;
    bVar9 = false;
    if ((long)local_548 != 0) {
      pcVar12 = pcVar12 + lVar11 + local_548;
      local_520 = &local_510;
      local_518 = 0;
      local_510 = '\0';
      sVar6 = strlen(pcVar12);
      local_540 = pcVar12;
      if (sVar6 < 0x400) {
        pcVar12 = local_438;
      }
      else {
        strlen(pcVar12);
        ::std::__cxx11::string::_M_replace((ulong)&local_520,0,(char *)0x0,(ulong)pcVar12);
        pcVar12 = local_520;
      }
      local_538 = (ulong)(uint)(iVar2 + iVar3 + (int)sVar5 + iVar4);
      bVar13 = 0 < nargs;
      if (0 < nargs) {
        local_4d8 = (long)(nargs + -1);
        local_4c8 = (ulong)(uint)nargs;
        uVar10 = 0;
        local_528 = pcVar12;
        do {
          local_541 = bVar13;
          Property::Property(&local_488);
          local_548 = 0;
          cVar8 = '\0';
          __isoc99_sscanf(local_540," %[^,)] %n",pcVar12,&local_548);
          pcVar12 = local_528;
          iVar4 = local_548;
          if (local_548 != 0) {
            pPVar1 = local_4c0[uVar10];
            local_500[0] = local_4f0;
            if (local_528 == (char *)0x0) {
              pcVar7 = (char *)0x1;
            }
            else {
              sVar5 = strlen(local_528);
              pcVar7 = pcVar12 + sVar5;
            }
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_500,pcVar12,pcVar7);
            local_4b8._0_8_ = local_4b8 + 0x18;
            local_4b8._16_8_ = 0;
            local_4b8._24_8_ = 0;
            local_498 = 0;
            local_490._0_4_ = 0x20;
            local_490._4_4_ = 0;
            local_4b8._8_8_ = local_4b8._0_8_;
            iVar3 = (*pPVar1->_vptr_PropertyParser[2])
                              (pPVar1,&local_488,(string *)local_500,local_4b8);
            cVar8 = (char)iVar3;
          }
          pcVar12 = local_528;
          if ((iVar4 != 0) &&
             (robin_hood::detail::
              Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::destroy((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_4b8), local_500[0] != local_4f0)) {
            operator_delete(local_500[0],local_4f0[0] + 1);
          }
          if (cVar8 == '\0') {
LAB_0025cf1a:
            bVar9 = false;
            pcVar7 = local_540;
          }
          else {
            local_52c = 0.0;
            Variant::GetInto<float,_0>(&local_488.value,&local_52c);
            local_4d0[uVar10].number = local_52c;
            local_4d0[uVar10].unit = local_488.unit;
            pcVar7 = local_540 + local_548;
            local_538 = (ulong)(uint)((int)local_538 + local_548);
            bVar9 = true;
            if ((long)uVar10 < local_4d8) {
              local_548 = 0;
              __isoc99_sscanf(pcVar7," , %n",&local_548);
              local_540 = pcVar7;
              if ((long)local_548 == 0) goto LAB_0025cf1a;
              local_538 = (ulong)(uint)((int)local_538 + local_548);
              pcVar7 = pcVar7 + local_548;
            }
          }
          local_540 = pcVar7;
          if (local_488.source.
              super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_488.source.
                       super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          Variant::~Variant(&local_488.value);
          bVar13 = local_541;
          if (!bVar9) break;
          uVar10 = uVar10 + 1;
          bVar13 = uVar10 < local_4c8;
        } while (uVar10 != local_4c8);
      }
      if ((bVar13 & 1) == 0) {
        local_548 = 0;
        bVar9 = false;
        __isoc99_sscanf(local_540," ) %n",&local_548);
        if (local_548 != 0) {
          iVar4 = local_548 + (int)local_538;
          *local_4e0 = iVar4;
          bVar9 = iVar4 != 0 && SCARRY4(local_548,(int)local_538) == iVar4 < 0;
        }
      }
      else {
        bVar9 = false;
      }
      if (local_520 != &local_510) {
        operator_delete(local_520,CONCAT71(uStack_50f,local_510) + 1);
      }
    }
  }
  return bVar9;
}

Assistant:

bool PropertyParserTransform::Scan(int& out_bytes_read, const char* str, const char* keyword, const PropertyParser** parsers, NumericValue* args,
	int nargs) const
{
	out_bytes_read = 0;
	int total_bytes_read = 0, bytes_read = 0;

	/* skip leading white space */
	bytes_read = 0;
	sscanf(str, " %n", &bytes_read);
	str += bytes_read;
	total_bytes_read += bytes_read;

	/* find the keyword */
	if (!memcmp(str, keyword, strlen(keyword)))
	{
		bytes_read = (int)strlen(keyword);
		str += bytes_read;
		total_bytes_read += bytes_read;
	}
	else
	{
		return false;
	}

	/* skip any white space */
	bytes_read = 0;
	sscanf(str, " %n", &bytes_read);
	str += bytes_read;
	total_bytes_read += bytes_read;

	/* find the opening brace */
	bytes_read = 0;
	if (sscanf(str, " ( %n", &bytes_read), bytes_read)
	{
		str += bytes_read;
		total_bytes_read += bytes_read;
	}
	else
	{
		return false;
	}

	/* use the quicker stack-based argument buffer, if possible */
	char* arg = nullptr;
	char arg_stack[1024];
	String arg_heap;
	if (strlen(str) < sizeof(arg_stack))
	{
		arg = arg_stack;
	}
	else
	{
		arg_heap = str;
		arg = &arg_heap[0];
	}

	/* parse the arguments */
	for (int i = 0; i < nargs; ++i)
	{
		Property prop;

		bytes_read = 0;
		if (sscanf(str, " %[^,)] %n", arg, &bytes_read), bytes_read && parsers[i]->ParseValue(prop, String(arg), ParameterMap()))
		{
			args[i].number = prop.value.Get<float>();
			args[i].unit = prop.unit;
			str += bytes_read;
			total_bytes_read += bytes_read;
		}
		else
		{
			return false;
		}

		/* find the comma */
		if (i < nargs - 1)
		{
			bytes_read = 0;
			if (sscanf(str, " , %n", &bytes_read), bytes_read)
			{
				str += bytes_read;
				total_bytes_read += bytes_read;
			}
			else
			{
				return false;
			}
		}
	}

	/* find the closing brace */
	bytes_read = 0;
	if (sscanf(str, " ) %n", &bytes_read), bytes_read)
	{
		str += bytes_read;
		total_bytes_read += bytes_read;
	}
	else
	{
		return false;
	}

	out_bytes_read = total_bytes_read;
	return total_bytes_read > 0;
}